

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_conn_setup(Curl_easy *data,connectdata *conn,int sockindex,Curl_dns_entry *remotehost,
                        int ssl_mode)

{
  CURLcode CVar1;
  Curl_cfilter *in_RAX;
  int ssl_mode_00;
  Curl_cfilter *cf;
  Curl_cfilter *local_38;
  
  ssl_mode_00 = ssl_mode;
  local_38 = in_RAX;
  if (((conn->cfilter[sockindex] == (Curl_cfilter *)0x0) && (conn->handler->protocol == 2)) &&
     (CVar1 = Curl_cf_https_setup(data,conn,sockindex,remotehost), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  CVar1 = CURLE_OK;
  if ((conn->cfilter[sockindex] == (Curl_cfilter *)0x0) &&
     (CVar1 = cf_setup_create(&local_38,(Curl_easy *)remotehost,
                              (Curl_dns_entry *)(ulong)conn->transport,ssl_mode,ssl_mode_00),
     CVar1 == CURLE_OK)) {
    Curl_conn_cf_add(data,conn,sockindex,local_38);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_conn_setup(struct Curl_easy *data,
                         struct connectdata *conn,
                         int sockindex,
                         const struct Curl_dns_entry *remotehost,
                         int ssl_mode)
{
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  DEBUGASSERT(conn->handler);

#if !defined(CURL_DISABLE_HTTP)
  if(!conn->cfilter[sockindex] &&
     conn->handler->protocol == CURLPROTO_HTTPS) {
    DEBUGASSERT(ssl_mode != CURL_CF_SSL_DISABLE);
    result = Curl_cf_https_setup(data, conn, sockindex, remotehost);
    if(result)
      goto out;
  }
#endif /* !defined(CURL_DISABLE_HTTP) */

  /* Still no cfilter set, apply default. */
  if(!conn->cfilter[sockindex]) {
    result = cf_setup_add(data, conn, sockindex, remotehost,
                          conn->transport, ssl_mode);
    if(result)
      goto out;
  }

  DEBUGASSERT(conn->cfilter[sockindex]);
out:
  return result;
}